

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall
IMLE<1,_1,_FastLinearExpert>::predictMultiple(IMLE<1,_1,_FastLinearExpert> *this,Z *z)

{
  bool bVar1;
  Scalar *pSVar2;
  Index in_RDI;
  int worseSol;
  int newSol2;
  int newSol1;
  Z *in_stack_00000208;
  IMLE<1,_1,_FastLinearExpert> *in_stack_00000210;
  IMLE<1,_1,_FastLinearExpert> *in_stack_000002b0;
  int *in_stack_00000300;
  int *in_stack_00000308;
  int *in_stack_00000310;
  IMLE<1,_1,_FastLinearExpert> *in_stack_00000318;
  int in_stack_000004a4;
  int in_stack_000004a8;
  int in_stack_000004ac;
  IMLE<1,_1,_FastLinearExpert> *in_stack_000004b0;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_ffffffffffffffe0;
  
  predict(in_stack_00000210,in_stack_00000208);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (in_stack_ffffffffffffffe0,in_RDI);
  if (((*pSVar2 != 0.0) || (NAN(*pSVar2))) &&
     (bVar1 = validForwardSolutions
                        (in_stack_00000318,in_stack_00000310,in_stack_00000308,in_stack_00000300),
     !bVar1)) {
    do {
      *(int *)(in_RDI + 0x254) = *(int *)(in_RDI + 0x254) + 1;
      clusterForwardSolutions
                (in_stack_000004b0,in_stack_000004ac,in_stack_000004a8,in_stack_000004a4);
      bVar1 = validForwardSolutions
                        (in_stack_00000318,in_stack_00000310,in_stack_00000308,in_stack_00000300);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
    getForwardSolutions(in_stack_000002b0);
  }
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::predictMultiple(Z const &z)
{
    predict(z);

    if( sum_p_z(0) == 0.0 )
        return;

    int newSol1, newSol2, worseSol;
    if( !validForwardSolutions(newSol1, newSol2, worseSol) )
    {

        do
        {
            nSolFound++;
            clusterForwardSolutions(newSol1, newSol2, worseSol);
        } while ( !validForwardSolutions(newSol1, newSol2, worseSol) );

        getForwardSolutions();
    }

    //          Not needed, already in predict()
    // hasPredJacobian = false;
    // hasPredErrorReductionDrvt = false;
}